

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc_unittest.cc
# Opt level: O3

void * __thiscall AllocatorState::alloc(AllocatorState *this,size_t size)

{
  long lVar1;
  void **val1;
  char *expr2;
  internal *this_00;
  void **in_R8;
  char *expr1;
  int iVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  void *local_38;
  void *result;
  
  lVar1 = random();
  if ((double)((int)lVar1 +
              ((int)(SUB168(SEXT816(lVar1) * ZEXT816(0xa3d70a3d70a3d70b),8) >> 6) -
              (SUB164(SEXT816(lVar1) * ZEXT816(0xa3d70a3d70a3d70b),0xc) >> 0x1f)) * -100) <
      this->memalign_fraction_ * 100.0) {
    auVar3._8_4_ = (int)(size >> 0x20);
    auVar3._0_8_ = size;
    auVar3._12_4_ = 0x45300000;
    iVar2 = 5;
    do {
      lVar1 = random();
      val1 = (void **)(lVar1 % 0x12);
      if ((void **)0x2 < val1) {
        expr1 = (char *)(1L << ((byte)val1 & 0x3f));
        auVar4._8_4_ = (int)((ulong)expr1 >> 0x20);
        auVar4._0_8_ = expr1;
        auVar4._12_4_ = 0x45300000;
        if ((size < 8) ||
           ((auVar4._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)expr1) - 4503599627370496.0) <
            ((auVar3._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)size) - 4503599627370496.0)) * 6.0)) {
          local_38 = (void *)0x1234;
          result = (void *)size;
          (*noopt_helper)(&result);
          iVar2 = posix_memalign(&local_38,(size_t)expr1,(size_t)result);
          result = (void *)CONCAT44(result._4_4_,iVar2);
          this_00 = (internal *)&result;
          (*noopt_helper)(this_00);
          if (((int)result != 0) && ((int)result != 0xc)) {
            alloc();
            if (*val1 == *in_R8) {
              testing::internal::CmpHelperOpFailure<void*,void*>
                        (this_00,expr1,expr2,val1,in_R8,"!=");
            }
            else {
              testing::AssertionSuccess();
            }
            return this_00;
          }
          if ((int)result == 0) {
            return local_38;
          }
          return (void *)0x0;
        }
      }
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
  }
  result = malloc(size);
  (*noopt_helper)(&result);
  return result;
}

Assistant:

void* alloc(size_t size) {
    if (Uniform(100) < memalign_fraction_ * 100) {
      // Try a few times to find a reasonable alignment, or fall back on malloc.
      for (int i = 0; i < 5; i++) {
        size_t alignment = size_t{1} << Uniform(FLAGS_lg_max_memalign);
        if (alignment >= sizeof(intptr_t) &&
            (size < sizeof(intptr_t) ||
             alignment < FLAGS_memalign_max_alignment_ratio * size)) {
          void *result = reinterpret_cast<void*>(static_cast<intptr_t>(0x1234));
          int err = PosixMemalign(&result, alignment, size);
          if (err != 0) {
            CHECK_EQ(err, ENOMEM);
          }
          return err == 0 ? result : nullptr;
        }
      }
    }
    return noopt(malloc(size));
  }